

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

MPP_RET read_image(RK_U8 *buf,FILE *fp,RK_U32 width,RK_U32 height,RK_U32 hor_stride,
                  RK_U32 ver_stride,MppFrameFormat fmt)

{
  MppFrameFormat MVar1;
  MPP_RET MVar2;
  size_t sVar3;
  char *pcVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  RK_S32 RStack_60;
  
  if ((fmt & 0xf00000) != MPP_FMT_YUV420SP) {
    uVar5 = (height + 0xf & 0xfffffff0) * (width + 0xf & 0xfffffff0);
    uVar7 = (uVar5 >> 4) + 0xfff & 0x1ffff000;
    if ((fmt & 0xf00000) != 0x100000) {
      uVar7 = uVar5 >> 4;
    }
    sVar3 = fread(buf,1,(ulong)uVar7,(FILE *)fp);
    if (uVar7 == (uint)sVar3) {
      MVar1 = fmt & 0xfffff;
      if ((MVar1 - MPP_FMT_YUV422_YUYV < 4) || (MVar1 == MPP_FMT_YUV422SP)) {
        uVar6 = (ulong)(uVar5 * 2);
        sVar3 = fread(buf + uVar7,1,uVar6,(FILE *)fp);
        uVar7 = (uint)sVar3;
        if (uVar5 * 2 == uVar7) {
          return MPP_OK;
        }
        pcVar4 = "read 422sp fbc file payload failed %d vs %d\n";
      }
      else {
        if (MVar1 != MPP_FMT_YUV420SP) {
          _mpp_log_l(2,"utils","not supported fbc format %x\n","read_image",fmt);
          return MPP_OK;
        }
        uVar5 = uVar5 * 3 >> 1;
        uVar6 = (ulong)uVar5;
        sVar3 = fread(buf + uVar7,1,uVar6,(FILE *)fp);
        uVar7 = (uint)sVar3;
        if (uVar5 == uVar7) {
          return MPP_OK;
        }
        pcVar4 = "read 420sp fbc file payload failed %d vs %d\n";
      }
      uVar9 = (ulong)uVar7;
    }
    else {
      pcVar4 = "read fbc file header failed %d vs %d\n";
      uVar9 = sVar3 & 0xffffffff;
      uVar6 = (ulong)uVar7;
    }
    _mpp_log_l(2,"utils",pcVar4,"read_image",uVar9,uVar6);
    return MPP_NOK;
  }
  MVar1 = fmt & 0xfffff;
  uVar7 = MVar1 - MPP_FMT_RGB565;
  if (uVar7 < 0xe) {
    if ((0x3fU >> (uVar7 & 0x1f) & 1) == 0) {
      if ((0x3f00U >> (uVar7 & 0x1f) & 1) != 0) {
        RStack_60 = 4;
        goto LAB_00108580;
      }
switchD_00108449_caseD_f:
      RStack_60 = 3;
      goto LAB_00108580;
    }
  }
  else {
    if (MPP_FMT_YUV444P < MVar1) {
switchD_00108449_caseD_1:
      _mpp_log_l(2,"utils","read image do not support fmt %d\n","read_image",fmt);
      return MPP_ERR_VALUE;
    }
    uVar7 = ver_stride * hor_stride;
    switch(MVar1) {
    case MPP_FMT_YUV420SP:
    case MPP_FMT_YUV420SP_VU:
      lVar8 = (ulong)height + 1;
      uVar6 = 0;
      do {
        lVar8 = lVar8 + -1;
        if (lVar8 == 0) {
          uVar11 = width + 1 & 0xfffffffe;
          lVar8 = (ulong)(height + 1 >> 1) + 1;
          uVar5 = 0;
          do {
            lVar8 = lVar8 + -1;
            if (lVar8 == 0) {
              return MPP_OK;
            }
            uVar6 = (ulong)uVar5;
            uVar5 = uVar5 + hor_stride;
            sVar3 = fread(buf + uVar6 + uVar7,1,(ulong)uVar11,(FILE *)fp);
          } while (uVar11 == (uint)sVar3);
          return MPP_NOK;
        }
        sVar3 = fread(buf + uVar6,1,(ulong)width,(FILE *)fp);
        uVar6 = (ulong)((int)uVar6 + hor_stride);
      } while ((RK_U32)sVar3 == width);
      return MPP_NOK;
    case MPP_FMT_YUV420SP_10BIT:
    case MPP_FMT_YUV422SP_10BIT:
    case MPP_FMT_YUV440SP:
    case MPP_FMT_YUV411SP:
      goto switchD_00108449_caseD_1;
    case MPP_FMT_YUV420P:
      lVar8 = (ulong)height + 1;
      uVar6 = 0;
      do {
        lVar8 = lVar8 + -1;
        if (lVar8 == 0) {
          uVar11 = height + 1 >> 1;
          uVar12 = width + 1 >> 1;
          iVar10 = uVar11 + 1;
          uVar5 = 0;
          do {
            iVar10 = iVar10 + -1;
            if (iVar10 == 0) {
              iVar10 = uVar11 + 1;
              uVar5 = 0;
              do {
                iVar10 = iVar10 + -1;
                if (iVar10 == 0) {
                  return MPP_OK;
                }
                sVar3 = fread(buf + (ulong)(uVar5 >> 1) + (ulong)(uVar7 >> 2) + (ulong)uVar7,1,
                              (ulong)uVar12,(FILE *)fp);
                uVar5 = uVar5 + hor_stride;
              } while (uVar12 == (uint)sVar3);
              return MPP_NOK;
            }
            sVar3 = fread(buf + (ulong)(uVar5 >> 1) + (ulong)uVar7,1,(ulong)uVar12,(FILE *)fp);
            uVar5 = uVar5 + hor_stride;
          } while (uVar12 == (uint)sVar3);
          return MPP_NOK;
        }
        sVar3 = fread(buf + uVar6,1,(ulong)width,(FILE *)fp);
        uVar6 = (ulong)((int)uVar6 + hor_stride);
      } while ((RK_U32)sVar3 == width);
      return MPP_NOK;
    case MPP_FMT_YUV400:
      RStack_60 = 1;
      goto LAB_00108580;
    case MPP_FMT_YUV444SP:
    case MPP_FMT_YUV444P:
      goto switchD_00108449_caseD_f;
    }
  }
  RStack_60 = 2;
LAB_00108580:
  MVar2 = read_with_pixel_width(buf,width,height,hor_stride,RStack_60,fp);
  return MVar2;
}

Assistant:

MPP_RET read_image(RK_U8 *buf, FILE *fp, RK_U32 width, RK_U32 height,
                   RK_U32 hor_stride, RK_U32 ver_stride, MppFrameFormat fmt)
{
    MPP_RET ret = MPP_OK;
    RK_U32 read_size;
    RK_U32 row = 0;
    RK_U8 *buf_y = buf;
    RK_U8 *buf_u = buf_y + hor_stride * ver_stride; // NOTE: diff from gen_yuv_image
    RK_U8 *buf_v = buf_u + hor_stride * ver_stride / 4; // NOTE: diff from gen_yuv_image

    if (MPP_FRAME_FMT_IS_FBC(fmt)) {
        RK_U32 align_w = MPP_ALIGN(width, 16);
        RK_U32 align_h = MPP_ALIGN(height, 16);
        RK_U32 header_size = 0;

        if ((fmt & MPP_FRAME_FBC_MASK) == MPP_FRAME_FBC_AFBC_V1)
            header_size = MPP_ALIGN(align_w * align_h / 16, SZ_4K);
        else
            header_size = align_w * align_h / 16;

        /* read fbc header first */
        read_size = fread(buf, 1, header_size, fp);
        if (read_size != header_size) {
            mpp_err_f("read fbc file header failed %d vs %d\n",
                      read_size, header_size);
            ret  = MPP_NOK;
            goto err;
        }
        buf += header_size;

        switch (fmt & MPP_FRAME_FMT_MASK) {
        case MPP_FMT_YUV420SP : {
            read_size = fread(buf, 1, align_w * align_h * 3 / 2, fp);
            if (read_size != align_w * align_h * 3 / 2) {
                mpp_err_f("read 420sp fbc file payload failed %d vs %d\n",
                          read_size, align_w * align_h * 3 / 2);
                ret  = MPP_NOK;
                goto err;
            }
        } break;
        case MPP_FMT_YUV422SP :
        case MPP_FMT_YUV422_YUYV :
        case MPP_FMT_YUV422_YVYU :
        case MPP_FMT_YUV422_UYVY :
        case MPP_FMT_YUV422_VYUY : {
            read_size = fread(buf, 1, align_w * align_h * 2, fp);
            if (read_size != align_w * align_h * 2) {
                mpp_err_f("read 422sp fbc file payload failed %d vs %d\n",
                          read_size, align_w * align_h * 2);
                ret  = MPP_NOK;
                goto err;
            }
        } break;
        default : {
            mpp_err_f("not supported fbc format %x\n", fmt);
        } break;
        }

        return MPP_OK;
    }

    switch (fmt & MPP_FRAME_FMT_MASK) {
    case MPP_FMT_YUV420SP_VU:
    case MPP_FMT_YUV420SP : {
        for (row = 0; row < height; row++) {
            read_size = fread(buf_y + row * hor_stride, 1, width, fp);
            if (read_size != width) {
                ret  = MPP_NOK;
                goto err;
            }
        }

        height = MPP_ALIGN(height, 2);
        width = MPP_ALIGN(width, 2);
        for (row = 0; row < height / 2; row++) {
            read_size = fread(buf_u + row * hor_stride, 1, width, fp);
            if (read_size != width) {
                ret  = MPP_NOK;
                goto err;
            }
        }
    } break;
    case MPP_FMT_YUV420P : {
        for (row = 0; row < height; row++) {
            read_size = fread(buf_y + row * hor_stride, 1, width, fp);
            if (read_size != width) {
                ret  = MPP_NOK;
                goto err;
            }
        }

        width = MPP_ALIGN(width, 2);
        height = MPP_ALIGN(height, 2);
        for (row = 0; row < height / 2; row++) {
            read_size = fread(buf_u + row * hor_stride / 2, 1, width / 2, fp);
            if (read_size != width / 2) {
                ret  = MPP_NOK;
                goto err;
            }
        }

        for (row = 0; row < height / 2; row++) {
            read_size = fread(buf_v + row * hor_stride / 2, 1, width / 2, fp);
            if (read_size != width / 2) {
                ret  = MPP_NOK;
                goto err;
            }
        }
    } break;
    case MPP_FMT_ARGB8888 :
    case MPP_FMT_ABGR8888 :
    case MPP_FMT_BGRA8888 :
    case MPP_FMT_RGBA8888 :
    case MPP_FMT_RGB101010 :
    case MPP_FMT_BGR101010 : {
        ret = read_with_pixel_width(buf_y, width, height, hor_stride, 4, fp);
    } break;
    case MPP_FMT_YUV422P :
    case MPP_FMT_YUV422SP :
    case MPP_FMT_YUV422SP_VU:
    case MPP_FMT_BGR444 :
    case MPP_FMT_RGB444 :
    case MPP_FMT_RGB555 :
    case MPP_FMT_BGR555 :
    case MPP_FMT_RGB565 :
    case MPP_FMT_BGR565 :
    case MPP_FMT_YUV422_YUYV :
    case MPP_FMT_YUV422_YVYU :
    case MPP_FMT_YUV422_UYVY :
    case MPP_FMT_YUV422_VYUY : {
        ret = read_with_pixel_width(buf_y, width, height, hor_stride, 2, fp);
    } break;
    case MPP_FMT_YUV444SP :
    case MPP_FMT_YUV444P :
    case MPP_FMT_RGB888 :
    case MPP_FMT_BGR888 : {
        ret = read_with_pixel_width(buf_y, width, height, hor_stride, 3, fp);
    } break;
    case MPP_FMT_YUV400 : {
        ret = read_with_pixel_width(buf_y, width, height, hor_stride, 1, fp);
    } break;
    default : {
        mpp_err_f("read image do not support fmt %d\n", fmt);
        ret = MPP_ERR_VALUE;
    } break;
    }

err:

    return ret;
}